

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

GLenum polyscope::render::backend_openGL3_glfw::type(TextureFormat *x)

{
  runtime_error *this;
  undefined4 *in_RDI;
  GLenum local_4;
  
  switch(*in_RDI) {
  case 0:
    local_4 = 0x1401;
    break;
  case 1:
    local_4 = 0x1401;
    break;
  case 2:
    local_4 = 0x140b;
    break;
  case 3:
    local_4 = 0x140b;
    break;
  case 4:
    local_4 = 0x140b;
    break;
  case 5:
    local_4 = 0x1406;
    break;
  case 6:
    local_4 = 0x1406;
    break;
  case 7:
    local_4 = 0x1406;
    break;
  case 8:
    local_4 = 0x1406;
    break;
  case 9:
    local_4 = 0x1406;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bad enum");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

inline GLenum type(const TextureFormat& x) {
  switch (x) {
    case TextureFormat::RGB8:       return GL_UNSIGNED_BYTE;
    case TextureFormat::RGBA8:      return GL_UNSIGNED_BYTE;
    case TextureFormat::RG16F:      return GL_HALF_FLOAT;
    case TextureFormat::RGB16F:     return GL_HALF_FLOAT;
    case TextureFormat::RGBA16F:    return GL_HALF_FLOAT;
    case TextureFormat::R32F:       return GL_FLOAT;
    case TextureFormat::R16F:       return GL_FLOAT;
    case TextureFormat::RGB32F:     return GL_FLOAT;
    case TextureFormat::RGBA32F:    return GL_FLOAT;
    case TextureFormat::DEPTH24:    return GL_FLOAT;
  }
  throw std::runtime_error("bad enum");
}